

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall
c4::yml::detail::stack<c4::yml::detail::ReferenceResolver::refdata,_16UL>::_free
          (stack<c4::yml::detail::ReferenceResolver::refdata,_16UL> *this)

{
  Location loc;
  Location loc_00;
  bool bVar1;
  error_flags eVar2;
  long in_RDI;
  size_t unaff_retaddr;
  char (*in_stack_ffffffffffffff78) [33];
  size_t in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  Location *in_stack_ffffffffffffff90;
  char (*in_stack_ffffffffffffffd0) [33];
  size_t sStack_28;
  char *in_stack_ffffffffffffffe0;
  Location *in_stack_ffffffffffffffe8;
  undefined8 in_stack_fffffffffffffff0;
  long lVar3;
  
  lVar3 = in_RDI;
  if (*(long *)(in_RDI + 0x300) == 0) {
    eVar2 = get_error_flags();
    if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
      trap_instruction();
    }
    Location::Location(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80
                       ,(size_t)in_stack_ffffffffffffff78);
    in_stack_ffffffffffffff90 = in_stack_ffffffffffffffe8;
    in_stack_ffffffffffffff88 = in_stack_ffffffffffffffe0;
    in_stack_ffffffffffffff78 = in_stack_ffffffffffffffd0;
    loc.super_LineCol.line = (size_t)in_stack_ffffffffffffff90;
    loc.super_LineCol.offset = (size_t)in_stack_ffffffffffffff88;
    loc.super_LineCol.col = in_stack_fffffffffffffff0;
    loc.name.str = (char *)lVar3;
    loc.name.len = unaff_retaddr;
    in_stack_ffffffffffffffd0 = in_stack_ffffffffffffff78;
    in_stack_ffffffffffffffe0 = in_stack_ffffffffffffff88;
    in_stack_ffffffffffffffe8 = in_stack_ffffffffffffff90;
    error<33ul>(in_stack_ffffffffffffff78,loc);
    in_stack_ffffffffffffff80 = sStack_28;
  }
  if (*(long *)(in_RDI + 0x300) == in_RDI) {
    if (*(long *)(in_RDI + 0x310) != 0x10) {
      eVar2 = get_error_flags();
      if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
        trap_instruction();
      }
      Location::Location(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                         in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78);
      loc_00.super_LineCol.line = (size_t)in_stack_ffffffffffffffe8;
      loc_00.super_LineCol.offset = (size_t)in_stack_ffffffffffffffe0;
      loc_00.super_LineCol.col = in_stack_fffffffffffffff0;
      loc_00.name.str = (char *)lVar3;
      loc_00.name.len = unaff_retaddr;
      error<30ul>((char (*) [30])in_stack_ffffffffffffffd0,loc_00);
    }
  }
  else {
    (**(code **)(in_RDI + 0x328))
              (*(undefined8 *)(in_RDI + 0x300),*(long *)(in_RDI + 0x310) * 0x30,
               *(undefined8 *)(in_RDI + 0x318));
    *(long *)(in_RDI + 0x300) = in_RDI;
    *(undefined8 *)(in_RDI + 0x308) = 0x10;
    *(undefined8 *)(in_RDI + 0x310) = 0x10;
  }
  return;
}

Assistant:

void stack<T, N>::_free()
{
    RYML_ASSERT(m_stack != nullptr); // this structure cannot be memset() to zero
    if(m_stack != m_buf)
    {
        m_callbacks.m_free(m_stack, m_capacity * sizeof(T), m_callbacks.m_user_data);
        m_stack = m_buf;
        m_size = N;
        m_capacity = N;
    }
    else
    {
        RYML_ASSERT(m_capacity == N);
    }
}